

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O1

void __thiscall
embree::CoronaLoader::CoronaLoader(CoronaLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Ref<embree::SceneGraph::Node> *child;
  undefined8 xfm;
  int iVar6;
  undefined4 uVar7;
  GroupNode *this_00;
  TransformNode *this_01;
  runtime_error *this_02;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong uVar10;
  Ref<embree::XML> xml;
  long *local_a8;
  Ref<embree::SceneGraph::Node> *local_a0;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  FileName::FileName(&this->path);
  p_Var1 = &(this->materialMap)._M_t._M_impl.super__Rb_tree_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureFileMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_a0 = &this->root;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->root).ptr = (Node *)0x0;
  FileName::path((FileName *)local_98,fileName);
  std::__cxx11::string::operator=((string *)this,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/.-","");
  parseXML((embree *)&local_a8,fileName,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_98._32_8_ = space;
  iVar6 = std::__cxx11::string::compare((char *)(local_a8 + 6));
  if (iVar6 != 0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(local_a8 + 2));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_98._0_8_ = *puVar8;
    psVar9 = puVar8 + 2;
    if ((size_type *)local_98._0_8_ == psVar9) {
      local_98._16_8_ = *psVar9;
      local_98._24_8_ = puVar8[3];
      local_98._0_8_ = local_98 + 0x10;
    }
    else {
      local_98._16_8_ = *psVar9;
    }
    local_98._8_8_ = puVar8[1];
    *puVar8 = psVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::runtime_error::runtime_error(this_02,(string *)local_98);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_a8[0x11] != local_a8[0x10]) {
    uVar10 = 0;
    do {
      loadNode((CoronaLoader *)local_98,(Ref<embree::XML> *)this);
      if ((long *)local_98._0_8_ != (long *)0x0) {
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ::push_back(&this_00->children,(value_type *)local_98);
      }
      if ((long *)local_98._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_98._0_8_ + 0x18))();
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)(local_a8[0x11] - local_a8[0x10] >> 3));
  }
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  xfm = local_98._32_8_;
  child = local_a0;
  if (local_a0->ptr != (Node *)0x0) {
    (*(local_a0->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_00;
  iVar6 = (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  auVar2._4_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vx).field_0.m128[1] == 0.0);
  auVar2._0_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vx).field_0.m128[0] == 1.0);
  auVar2._8_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vx).field_0.m128[2] == 0.0);
  auVar2._12_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vx).field_0.m128[3] == 0.0);
  uVar7 = movmskps(iVar6,auVar2);
  if ((~(byte)uVar7 & 7) == 0) {
    auVar3._4_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vy).field_0.m128[1] == 1.0);
    auVar3._0_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vy).field_0.m128[0] == 0.0);
    auVar3._8_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vy).field_0.m128[2] == 0.0);
    auVar3._12_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vy).field_0.m128[3] == 0.0);
    uVar7 = movmskps(CONCAT31((int3)((uint)uVar7 >> 8),~(byte)uVar7),auVar3);
    if ((~(byte)uVar7 & 7) == 0) {
      auVar4._4_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vz).field_0.m128[1] == 0.0);
      auVar4._0_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vz).field_0.m128[0] == 0.0);
      auVar4._8_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vz).field_0.m128[2] == 1.0);
      auVar4._12_4_ = -(uint)((((LinearSpace3<embree::Vec3fa> *)xfm)->vz).field_0.m128[3] == 0.0);
      uVar7 = movmskps(CONCAT31((int3)((uint)uVar7 >> 8),~(byte)uVar7),auVar4);
      if ((~(byte)uVar7 & 7) == 0) {
        auVar5._4_4_ = -(uint)((((Vector *)(xfm + 0x30))->field_0).m128[1] == 0.0);
        auVar5._0_4_ = -(uint)((((Vector *)(xfm + 0x30))->field_0).m128[0] == 0.0);
        auVar5._8_4_ = -(uint)((((Vector *)(xfm + 0x30))->field_0).m128[2] == 0.0);
        auVar5._12_4_ = -(uint)((((Vector *)(xfm + 0x30))->field_0).m128[3] == 0.0);
        uVar7 = movmskps(CONCAT31((int3)((uint)uVar7 >> 8),~(byte)uVar7),auVar5);
        if ((~(byte)uVar7 & 7) == 0) goto LAB_001a9e05;
      }
    }
  }
  this_01 = (TransformNode *)alignedMalloc(0xa0,0x10);
  SceneGraph::TransformNode::TransformNode(this_01,(AffineSpace3fa *)xfm,child);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if (child->ptr != (Node *)0x0) {
    (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_01;
LAB_001a9e05:
  if (local_a8 != (long *)0x0) {
    (**(code **)(*local_a8 + 0x18))();
  }
  return;
}

Assistant:

CoronaLoader::CoronaLoader(const FileName& fileName, const AffineSpace3fa& space)
  {
    path = fileName.path();
    Ref<XML> xml = parseXML(fileName,"/.-",false);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->children.size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }